

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta,
          longdouble objective_amplifier)

{
  int k;
  int iVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  bool bVar6;
  uint r_size;
  int *piVar7;
  _Head_base<0UL,_int_*,_false> _Var8;
  bit_array *x_00;
  bool bVar9;
  uint uVar10;
  long lVar11;
  rc_data *__last;
  rc_data *__first;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar13;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_68;
  _Head_base<0UL,_int_*,_false> local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_3c = delta;
  local_48 = kappa;
  piVar7 = (first->current)._M_current;
  if (piVar7 == (last->current)._M_current) {
    bVar9 = false;
  }
  else {
    local_54 = theta;
    bVar9 = false;
    lVar13 = in_ST4;
    do {
      k = piVar7[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_68,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_60._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar11 = *(long *)(this + 0x50);
        _Var8._M_head_impl = local_60._M_head_impl;
        do {
          iVar1 = *_Var8._M_head_impl;
          _Var8._M_head_impl = _Var8._M_head_impl + 8;
          *(longdouble *)(lVar11 + (long)iVar1 * 0x10) =
               *(longdouble *)(lVar11 + (long)iVar1 * 0x10) * local_54;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var8._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      x_00 = x;
      r_size = solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                           *)this,(row_iterator)local_60._M_head_impl,
                          (row_iterator)
                          local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (r_size != 0) {
        __first = *(rc_data **)(this + 0x58);
        lVar11 = 0;
        lVar12 = in_ST0;
        lVar2 = in_ST1;
        lVar3 = in_ST2;
        lVar4 = in_ST3;
        lVar5 = in_ST4;
        in_ST4 = lVar13;
        do {
          in_ST3 = lVar5;
          in_ST2 = lVar4;
          in_ST1 = lVar3;
          in_ST0 = lVar2;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x70),
                     (quadratic_cost_type<long_double> *)
                     (ulong)*(uint *)((long)&__first->id + lVar11),(int)x,x_00);
          __first = *(rc_data **)(this + 0x58);
          *(longdouble *)((long)&__first->value + lVar11) =
               *(longdouble *)((long)&__first->value + lVar11) + objective_amplifier * lVar12;
          lVar11 = lVar11 + 0x20;
          lVar12 = in_ST0;
          lVar2 = in_ST1;
          lVar3 = in_ST2;
          lVar4 = in_ST3;
          lVar5 = in_ST4;
        } while ((ulong)r_size << 5 != lVar11);
        lVar13 = in_ST4;
        if (1 < (int)r_size) {
          lVar11 = (long)(int)r_size;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar11,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar11);
          __last = __first + 1;
          lVar11 = lVar11 * 0x20 + -0x20;
          do {
            if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last,__g);
              __first = __last;
            }
            __last = __last + 1;
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,__last,__g);
        }
      }
      uVar10 = *(uint *)(*(long *)(this + 0x60) + (long)k * 4);
      if ((int)r_size < (int)uVar10) {
        uVar10 = r_size;
      }
      bVar6 = affect<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                          *)this,x,(row_value *)local_60._M_head_impl,k,uVar10 - 1,r_size,local_48,
                         local_3c);
      bVar9 = (bool)(bVar9 | bVar6);
      piVar7 = (first->current)._M_current + -1;
      (first->current)._M_current = piVar7;
    } while (piVar7 != (last->current)._M_current);
  }
  return bVar9;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }